

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Prs_ManWriteVerilogMux(FILE *pFile,Prs_Ntk_t *p,Vec_Int_t *vSigs)

{
  int iVar1;
  char *local_58;
  char *pStrs [4];
  int ActSig;
  int FormId;
  int i;
  Vec_Int_t *vSigs_local;
  Prs_Ntk_t *p_local;
  FILE *pFile_local;
  
  local_58 = " = ";
  pStrs[0] = " ? ";
  pStrs[1] = " : ";
  pStrs[2] = ";\n";
  iVar1 = Vec_IntSize(vSigs);
  if (iVar1 == 8) {
    fprintf((FILE *)pFile,"  assign ");
    iVar1 = Vec_IntEntry(vSigs,1);
    Prs_ManWriteVerilogSignal(pFile,p,iVar1);
    fprintf((FILE *)pFile,"%s",local_58);
    for (ActSig = 2; iVar1 = Vec_IntSize(vSigs), ActSig + 1 < iVar1; ActSig = ActSig + 2) {
      Vec_IntEntry(vSigs,ActSig);
      iVar1 = Vec_IntEntry(vSigs,ActSig + 1);
      Prs_ManWriteVerilogSignal(pFile,p,iVar1);
      fprintf((FILE *)pFile,"%s",pStrs[(long)(ActSig / 2) + -1]);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vSigs) == 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteVer.c"
                ,0xdd,"void Prs_ManWriteVerilogMux(FILE *, Prs_Ntk_t *, Vec_Int_t *)");
}

Assistant:

static void Prs_ManWriteVerilogMux( FILE * pFile, Prs_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, FormId, ActSig;
    char * pStrs[4] = { " = ", " ? ", " : ", ";\n" };
    assert( Vec_IntSize(vSigs) == 8 );
    fprintf( pFile, "  assign " );
    Prs_ManWriteVerilogSignal( pFile, p, Vec_IntEntry(vSigs, 1) );
    fprintf( pFile, "%s", pStrs[0] );
    Vec_IntForEachEntryDoubleStart( vSigs, FormId, ActSig, i, 2 )
    {
        Prs_ManWriteVerilogSignal( pFile, p, ActSig );
        fprintf( pFile, "%s", pStrs[i/2] );
    }
}